

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O0

void scalarover_dsp(t_scalarover *x,t_signal **sp)

{
  t_signal **sp_local;
  t_scalarover *x_local;
  
  if (((*sp)->s_n & 7U) == 0) {
    dsp_add(scalarover_perf8,4,(*sp)->s_vec,&x->x_g,sp[1]->s_vec,(long)(*sp)->s_n);
  }
  else {
    dsp_add(scalarover_perform,4,(*sp)->s_vec,&x->x_g,sp[1]->s_vec,(long)(*sp)->s_n);
  }
  return;
}

Assistant:

static void scalarover_dsp(t_scalarover *x, t_signal **sp)
{
    if (sp[0]->s_n&7)
        dsp_add(scalarover_perform, 4, sp[0]->s_vec, &x->x_g,
            sp[1]->s_vec, (t_int)sp[0]->s_n);
    else
        dsp_add(scalarover_perf8, 4, sp[0]->s_vec, &x->x_g,
            sp[1]->s_vec, (t_int)sp[0]->s_n);
}